

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O1

bool __thiscall OpenMD::SelectionCompiler::isNameValid(SelectionCompiler *this,string *name)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  
  if (name->_M_string_length != 0) {
    uVar2 = 0;
    iVar4 = 0;
    iVar3 = 0;
    do {
      cVar1 = (name->_M_dataplus)._M_p[uVar2];
      if (cVar1 == '.') {
        iVar4 = iVar4 + 1;
      }
      else if (cVar1 == ']') {
        iVar3 = iVar3 + -1;
      }
      else if (cVar1 == '[') {
        iVar3 = iVar3 + 1;
      }
      uVar2 = uVar2 + 1;
    } while ((uVar2 & 0xffffffff) < name->_M_string_length);
    return iVar3 == 0 && iVar4 < 4;
  }
  return true;
}

Assistant:

bool SelectionCompiler::isNameValid(const std::string& name) {
    int nbracket = 0;
    int ndot     = 0;
    for (unsigned int i = 0; i < name.size(); ++i) {
      switch (name[i]) {
      case '[':
        ++nbracket;
        break;
      case ']':
        --nbracket;
        break;
      case '.':
        ++ndot;
        break;
      }
    }

    // only allow 3 dots at most
    return (ndot <= 3 && nbracket == 0) ? true : false;
  }